

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_zip.c
# Opt level: O0

int zip_version_does_symlinks(PHYSFS_uint32 version)

{
  uint uVar1;
  int local_10;
  PHYSFS_uint8 hosttype;
  int retval;
  PHYSFS_uint32 version_local;
  
  local_10 = 0;
  uVar1 = version >> 8 & 0xff;
  if ((((2 < uVar1) && (uVar1 != 4)) && (uVar1 != 6)) &&
     (((uVar1 != 0xb && (2 < uVar1 - 0xd)) && (uVar1 != 0x12)))) {
    local_10 = 1;
  }
  return local_10;
}

Assistant:

static int zip_version_does_symlinks(PHYSFS_uint32 version)
{
    int retval = 0;
    PHYSFS_uint8 hosttype = (PHYSFS_uint8) ((version >> 8) & 0xFF);

    switch (hosttype)
    {
            /*
             * These are the platforms that can NOT build an archive with
             *  symlinks, according to the Info-ZIP project.
             */
        case 0:  /* FS_FAT_  */
        case 1:  /* AMIGA_   */
        case 2:  /* VMS_     */
        case 4:  /* VM_CSM_  */
        case 6:  /* FS_HPFS_ */
        case 11: /* FS_NTFS_ */
        case 14: /* FS_VFAT_ */
        case 13: /* ACORN_   */
        case 15: /* MVS_     */
        case 18: /* THEOS_   */
            break;  /* do nothing. */

        default:  /* assume the rest to be unix-like. */
            retval = 1;
            break;
    } /* switch */

    return retval;
}